

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeGetOptimalReserve(Btree *p)

{
  int iVar1;
  Btree *in_RDI;
  int n;
  
  sqlite3BtreeEnter((Btree *)0x17d663);
  iVar1 = sqlite3BtreeGetReserveNoMutex(in_RDI);
  sqlite3BtreeLeave((Btree *)0x17d67b);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeGetOptimalReserve(Btree *p){
  int n;
  sqlite3BtreeEnter(p);
  n = sqlite3BtreeGetReserveNoMutex(p);
#ifdef SQLITE_HAS_CODEC
  if( n<p->pBt->optimalReserve ) n = p->pBt->optimalReserve;
#endif
  sqlite3BtreeLeave(p);
  return n;
}